

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.h
# Opt level: O2

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxBoundFlippingRT
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  ~SPxBoundFlippingRT(this);
  operator_delete(this,0x208);
  return;
}

Assistant:

virtual ~SPxBoundFlippingRT()
   {}